

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowPrepareCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_2c);
    if (pvVar2 != (void *)0x0) {
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffef;
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf | 0x20;
    }
  }
  pAVar3 = Aig_ManConst1(p);
  *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffdf;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,local_2c);
    *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vUpper), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vUpper,local_2c);
    Llb_ManFlowCleanMarkB_rec(pAVar3);
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vLower);
    if (iVar1 <= local_2c) {
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vLower,local_2c);
    if ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) != 0) break;
    Llb_ManFlowSetMarkA_rec(pAVar3);
    local_2c = local_2c + 1;
  }
  __assert_fail("pObj->fMarkB == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                ,0x3d3,"void Llb_ManFlowPrepareCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManFlowPrepareCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Aig_Obj_t * pObj;
    int i;
    // reset marks
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->fMarkB = 1;
    }
    // clean PIs and const
    Aig_ManConst1(p)->fMarkB = 0;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkB = 0;
    // clean upper cut
//printf( "Upper: ");
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        Llb_ManFlowCleanMarkB_rec( pObj );
//printf( "%d ", pObj->Id );
    }
//printf( "\n" );
    // set lower cut
//printf( "Lower: ");
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
    {
//printf( "%d ", pObj->Id );
        assert( pObj->fMarkB == 0 );
        Llb_ManFlowSetMarkA_rec( pObj );
    }
//printf( "\n" );
}